

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3PagerExclusiveLock(Pager *pPager)

{
  int iVar1;
  
  if (pPager->errCode != 0) {
    return pPager->errCode;
  }
  iVar1 = 0;
  if (pPager->pWal == (Wal *)0x0) {
    do {
      iVar1 = pagerLockDb(pPager,4);
      if (iVar1 != 5) {
        return iVar1;
      }
      iVar1 = (*pPager->xBusyHandler)(pPager->pBusyHandlerArg);
    } while (iVar1 != 0);
    iVar1 = 5;
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerExclusiveLock(Pager *pPager){
  int rc = pPager->errCode;
  assert( assert_pager_state(pPager) );
  if( rc==SQLITE_OK ){
    assert( pPager->eState==PAGER_WRITER_CACHEMOD
         || pPager->eState==PAGER_WRITER_DBMOD
         || pPager->eState==PAGER_WRITER_LOCKED
    );
    assert( assert_pager_state(pPager) );
    if( 0==pagerUseWal(pPager) ){
      rc = pager_wait_on_lock(pPager, EXCLUSIVE_LOCK);
    }
  }
  return rc;
}